

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smf_tempo.c
# Opt level: O3

smf_tempo_t * smf_get_tempo_by_seconds(smf_t *smf,double seconds)

{
  GPtrArray *pGVar1;
  smf_tempo_t *psVar2;
  guint number;
  
  if (seconds < 0.0) {
    __assert_fail("seconds >= 0.0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/davidhsilaban[P]munt/mt32emu_smf2wav/libsmf/src/smf_tempo.c"
                  ,0x12f,"smf_tempo_t *smf_get_tempo_by_seconds(const smf_t *, double)");
  }
  pGVar1 = smf->tempo_array;
  if ((seconds != 0.0) || (NAN(seconds))) {
    if (pGVar1 == (GPtrArray *)0x0) {
      __assert_fail("smf->tempo_array != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/davidhsilaban[P]munt/mt32emu_smf2wav/libsmf/src/smf_tempo.c"
                    ,0x134,"smf_tempo_t *smf_get_tempo_by_seconds(const smf_t *, double)");
    }
    number = pGVar1->len;
    do {
      number = number - 1;
      if ((int)number < 0) goto LAB_0010f68a;
      psVar2 = smf_get_tempo_by_number(smf,number);
      if (psVar2 == (smf_tempo_t *)0x0) {
        __assert_fail("tempo",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/davidhsilaban[P]munt/mt32emu_smf2wav/libsmf/src/smf_tempo.c"
                      ,0x139,"smf_tempo_t *smf_get_tempo_by_seconds(const smf_t *, double)");
      }
    } while (seconds < psVar2->time_seconds || seconds == psVar2->time_seconds);
  }
  else if (pGVar1->len == 0) {
LAB_0010f68a:
    psVar2 = (smf_tempo_t *)0x0;
  }
  else {
    psVar2 = (smf_tempo_t *)*pGVar1->pdata;
  }
  return psVar2;
}

Assistant:

smf_tempo_t *
smf_get_tempo_by_seconds(const smf_t *smf, double seconds)
{
	int i;
	smf_tempo_t *tempo;

	assert(seconds >= 0.0);

	if (seconds == 0.0)
		return (smf_get_tempo_by_number(smf, 0));

	assert(smf->tempo_array != NULL);
	
	for (i = smf->tempo_array->len - 1; i >= 0; i--) {
		tempo = smf_get_tempo_by_number(smf, i);

		assert(tempo);
		if (tempo->time_seconds < seconds)
			return (tempo);
	}

	return (NULL);
}